

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void prvTidyParseBlock(TidyDocImpl *doc,Node *element,GetTokenMode mode)

{
  Lexer *pLVar1;
  Node *pNVar2;
  bool bVar3;
  Bool BVar4;
  int iVar5;
  tmbstr ptVar6;
  Dict *pDVar7;
  uint local_38;
  uint istackbase;
  Bool checkstack;
  Node *node;
  Lexer *lexer;
  GetTokenMode mode_local;
  Node *element_local;
  TidyDocImpl *doc_local;
  
  pLVar1 = doc->lexer;
  bVar3 = true;
  local_38 = 0;
  if ((element->tag->model & 1) != 0) {
    return;
  }
  if ((((element != (Node *)0x0) && (element->tag != (Dict *)0x0)) &&
      (element->tag->id == TidyTag_FORM)) &&
     (BVar4 = DescendantOf(element,TidyTag_FORM), BVar4 != no)) {
    prvTidyReportError(doc,element,(Node *)0x0,0xe1);
  }
  if ((element->tag->model & 0x800) != 0) {
    local_38 = pLVar1->istackbase;
    pLVar1->istackbase = pLVar1->istacksize;
  }
  if ((element->tag->model & 0x20000) == 0) {
    prvTidyInlineDup(doc,(Node *)0x0);
  }
  if (((element->tag->model & 0x10) == 0) || ((element->tag->model & 0x400) != 0)) {
    lexer._4_4_ = IgnoreWhitespace;
  }
  else {
    lexer._4_4_ = mode;
    if (mode == IgnoreWhitespace) {
      lexer._4_4_ = MixedContent;
    }
  }
LAB_0012f277:
  _istackbase = prvTidyGetToken(doc,lexer._4_4_);
  if (_istackbase == (Node *)0x0) {
LAB_0013005b:
    if ((element->tag->model & 0x8000) == 0) {
      prvTidyReportError(doc,element,_istackbase,0xce);
    }
    if ((element->tag->model & 0x800) != 0) {
      while (pLVar1->istackbase < pLVar1->istacksize) {
        prvTidyPopInline(doc,(Node *)0x0);
      }
      pLVar1->istackbase = local_38;
    }
    TrimSpaces(doc,element);
    return;
  }
  if (((_istackbase->type == EndTag) && (_istackbase->tag != (Dict *)0x0)) &&
     ((_istackbase->tag == element->tag || (element->was == _istackbase->tag)))) {
    prvTidyFreeNode(doc,_istackbase);
    if ((element->tag->model & 0x800) != 0) {
      while (pLVar1->istackbase < pLVar1->istacksize) {
        prvTidyPopInline(doc,(Node *)0x0);
      }
      pLVar1->istackbase = local_38;
    }
    element->closed = yes;
    TrimSpaces(doc,element);
    return;
  }
  if ((((_istackbase != (Node *)0x0) && (_istackbase->tag != (Dict *)0x0)) &&
      (_istackbase->tag->id == TidyTag_BODY)) &&
     (BVar4 = DescendantOf(element,TidyTag_HEAD), BVar4 != no)) {
    prvTidyUngetToken(doc);
    goto LAB_0013005b;
  }
  if ((((_istackbase != (Node *)0x0) && (_istackbase->tag != (Dict *)0x0)) &&
      (_istackbase->tag->id == TidyTag_HTML)) ||
     ((((_istackbase != (Node *)0x0 && (_istackbase->tag != (Dict *)0x0)) &&
       (_istackbase->tag->id == TidyTag_HEAD)) ||
      (((_istackbase != (Node *)0x0 && (_istackbase->tag != (Dict *)0x0)) &&
       (_istackbase->tag->id == TidyTag_BODY)))))) {
    BVar4 = prvTidynodeIsElement(_istackbase);
    if (BVar4 != no) {
      prvTidyReportError(doc,element,_istackbase,0xd0);
    }
    prvTidyFreeNode(doc,_istackbase);
    goto LAB_0012f277;
  }
  if (_istackbase->type == EndTag) {
    if (_istackbase->tag == (Dict *)0x0) {
      prvTidyReportError(doc,element,_istackbase,0xd0);
      prvTidyFreeNode(doc,_istackbase);
      goto LAB_0012f277;
    }
    if (((_istackbase != (Node *)0x0) && (_istackbase->tag != (Dict *)0x0)) &&
       (_istackbase->tag->id == TidyTag_BR)) {
      _istackbase->type = StartTag;
      goto LAB_0012f549;
    }
    if (((_istackbase == (Node *)0x0) || (_istackbase->tag == (Dict *)0x0)) ||
       (_istackbase->tag->id != TidyTag_P)) {
      BVar4 = DescendantOf(element,_istackbase->tag->id);
      if (BVar4 != no) {
        prvTidyUngetToken(doc);
        goto LAB_0013005b;
      }
      if ((pLVar1->exiled != no) &&
         ((BVar4 = prvTidynodeHasCM(_istackbase,0x80), BVar4 != no ||
          (((_istackbase != (Node *)0x0 && (_istackbase->tag != (Dict *)0x0)) &&
           (_istackbase->tag->id == TidyTag_TABLE)))))) {
        prvTidyUngetToken(doc);
        TrimSpaces(doc,element);
        return;
      }
    }
    else {
      _istackbase->type = StartEndTag;
      _istackbase->implicit = yes;
    }
  }
LAB_0012f549:
  BVar4 = prvTidynodeIsText(_istackbase);
  if (BVar4 == no) {
    BVar4 = InsertMisc(element,_istackbase);
    if (BVar4 == no) {
      if (((_istackbase != (Node *)0x0) && (_istackbase->tag != (Dict *)0x0)) &&
         (_istackbase->tag->id == TidyTag_PARAM)) {
        BVar4 = prvTidynodeHasCM(element,0x1000);
        if ((BVar4 == no) || (BVar4 = prvTidynodeIsElement(_istackbase), BVar4 == no)) {
          prvTidyReportError(doc,element,_istackbase,0xd0);
          prvTidyFreeNode(doc,_istackbase);
        }
        else {
          prvTidyInsertNodeAtEnd(element,_istackbase);
        }
        goto LAB_0012f277;
      }
      if (((_istackbase != (Node *)0x0) && (_istackbase->tag != (Dict *)0x0)) &&
         (_istackbase->tag->id == TidyTag_AREA)) {
        if (((element == (Node *)0x0) || (element->tag == (Dict *)0x0)) ||
           ((element->tag->id != TidyTag_MAP ||
            (BVar4 = prvTidynodeIsElement(_istackbase), BVar4 == no)))) {
          prvTidyReportError(doc,element,_istackbase,0xd0);
          prvTidyFreeNode(doc,_istackbase);
        }
        else {
          prvTidyInsertNodeAtEnd(element,_istackbase);
        }
        goto LAB_0012f277;
      }
      if (_istackbase->tag == (Dict *)0x0) {
        prvTidyReportError(doc,element,_istackbase,0xd0);
        prvTidyFreeNode(doc,_istackbase);
        goto LAB_0012f277;
      }
      BVar4 = prvTidynodeHasCM(_istackbase,0x10);
      if (BVar4 == no) {
        BVar4 = prvTidynodeIsElement(_istackbase);
        if (BVar4 == no) {
          if (((_istackbase != (Node *)0x0) && (_istackbase->tag != (Dict *)0x0)) &&
             (_istackbase->tag->id == TidyTag_FORM)) {
            BadForm(doc);
          }
          prvTidyReportError(doc,element,_istackbase,0xd0);
          prvTidyFreeNode(doc,_istackbase);
          goto LAB_0012f277;
        }
        if ((((element != (Node *)0x0) && (element->tag != (Dict *)0x0)) &&
            (element->tag->id == TidyTag_LI)) &&
           ((((_istackbase != (Node *)0x0 && (_istackbase->tag != (Dict *)0x0)) &&
             (_istackbase->tag->id == TidyTag_FRAME)) ||
            (((((_istackbase != (Node *)0x0 && (_istackbase->tag != (Dict *)0x0)) &&
               (_istackbase->tag->id == TidyTag_FRAMESET)) ||
              (((_istackbase != (Node *)0x0 && (_istackbase->tag != (Dict *)0x0)) &&
               (_istackbase->tag->id == TidyTag_OPTGROUP)))) ||
             (((_istackbase != (Node *)0x0 && (_istackbase->tag != (Dict *)0x0)) &&
              (_istackbase->tag->id == TidyTag_OPTION)))))))) {
          prvTidyReportError(doc,element,_istackbase,0xd0);
          prvTidyFreeNode(doc,_istackbase);
          goto LAB_0012f277;
        }
        if ((((element == (Node *)0x0) || (element->tag == (Dict *)0x0)) ||
            (element->tag->id != TidyTag_TD)) &&
           (((element == (Node *)0x0 || (element->tag == (Dict *)0x0)) ||
            (element->tag->id != TidyTag_TH)))) {
          BVar4 = prvTidynodeHasCM(_istackbase,8);
          if (BVar4 == no) {
            if ((_istackbase->tag->model & 4) != 0) {
              MoveToHead(doc,element,_istackbase);
              goto LAB_0012f277;
            }
            if (((element != (Node *)0x0) && (element->tag != (Dict *)0x0)) &&
               ((element->tag->id == TidyTag_FORM &&
                ((((element->parent != (Node *)0x0 && (element->parent->tag != (Dict *)0x0)) &&
                  (element->parent->tag->id == TidyTag_TD)) && (element->parent->implicit != no)))))
               ) {
              if (((_istackbase != (Node *)0x0) && (_istackbase->tag != (Dict *)0x0)) &&
                 (_istackbase->tag->id == TidyTag_TD)) {
                prvTidyReportError(doc,element,_istackbase,0xd0);
                prvTidyFreeNode(doc,_istackbase);
                goto LAB_0012f277;
              }
              if (((_istackbase != (Node *)0x0) && (_istackbase->tag != (Dict *)0x0)) &&
                 (_istackbase->tag->id == TidyTag_TH)) {
                prvTidyReportError(doc,element,_istackbase,0xd0);
                prvTidyFreeNode(doc,_istackbase);
                pNVar2 = element->parent;
                (*doc->allocator->vtbl->free)(doc->allocator,pNVar2->element);
                ptVar6 = prvTidytmbstrdup(doc->allocator,"th");
                pNVar2->element = ptVar6;
                pDVar7 = prvTidyLookupTagDef(TidyTag_TH);
                pNVar2->tag = pDVar7;
                goto LAB_0012f277;
              }
            }
            BVar4 = prvTidynodeHasCM(element,0x8000);
            if ((BVar4 == no) && (element->implicit == no)) {
              prvTidyReportError(doc,element,_istackbase,0xcf);
            }
            prvTidyUngetToken(doc);
            BVar4 = prvTidynodeHasCM(_istackbase,0x20);
            if (BVar4 == no) {
              BVar4 = prvTidynodeHasCM(_istackbase,0x40);
              if (BVar4 == no) {
                BVar4 = prvTidynodeHasCM(_istackbase,0x80);
                if ((BVar4 == no) && (BVar4 = prvTidynodeHasCM(_istackbase,0x200), BVar4 == no)) {
                  BVar4 = prvTidynodeHasCM(element,0x800);
                  if (BVar4 != no) {
                    while (pLVar1->istackbase < pLVar1->istacksize) {
                      prvTidyPopInline(doc,(Node *)0x0);
                    }
                    pLVar1->istackbase = local_38;
                    TrimSpaces(doc,element);
                    return;
                  }
                  TrimSpaces(doc,element);
                  return;
                }
                if (pLVar1->exiled != no) {
                  return;
                }
                _istackbase = prvTidyInferredTag(doc,TidyTag_TABLE);
              }
              else {
                if (((element->parent != (Node *)0x0) && (element->parent->tag != (Dict *)0x0)) &&
                   (element->parent->tag->id == TidyTag_DL)) {
                  TrimSpaces(doc,element);
                  return;
                }
                _istackbase = prvTidyInferredTag(doc,TidyTag_DL);
              }
            }
            else {
              if (((element->parent != (Node *)0x0) && (element->parent->tag != (Dict *)0x0)) &&
                 (element->parent->tag->parser == prvTidyParseList)) {
                TrimSpaces(doc,element);
                return;
              }
              _istackbase = prvTidyInferredTag(doc,TidyTag_UL);
              AddClassNoIndent(doc,_istackbase);
            }
          }
          else if (pLVar1->excludeBlocks != no) {
            BVar4 = prvTidynodeHasCM(element,0x8000);
            if (BVar4 == no) {
              prvTidyReportError(doc,element,_istackbase,0xcf);
            }
            prvTidyUngetToken(doc);
            BVar4 = prvTidynodeHasCM(element,0x800);
            if (BVar4 != no) {
              pLVar1->istackbase = local_38;
            }
            TrimSpaces(doc,element);
            return;
          }
        }
        else {
          BVar4 = prvTidynodeHasCM(_istackbase,4);
          if (BVar4 != no) {
            MoveToHead(doc,element,_istackbase);
            goto LAB_0012f277;
          }
          BVar4 = prvTidynodeHasCM(_istackbase,0x20);
          if (BVar4 == no) {
            BVar4 = prvTidynodeHasCM(_istackbase,0x40);
            if (BVar4 != no) {
              prvTidyUngetToken(doc);
              _istackbase = prvTidyInferredTag(doc,TidyTag_DL);
              pLVar1->excludeBlocks = yes;
            }
          }
          else {
            prvTidyUngetToken(doc);
            _istackbase = prvTidyInferredTag(doc,TidyTag_UL);
            AddClassNoIndent(doc,_istackbase);
            pLVar1->excludeBlocks = yes;
          }
          BVar4 = prvTidynodeHasCM(_istackbase,8);
          if (BVar4 == no) {
            prvTidyUngetToken(doc);
            TrimSpaces(doc,element);
            return;
          }
        }
      }
      if (((_istackbase != (Node *)0x0) && (_istackbase->tag != (Dict *)0x0)) &&
         (((_istackbase->tag->id == TidyTag_A && (_istackbase->implicit == no)) &&
          ((((element != (Node *)0x0 && (element->tag != (Dict *)0x0)) &&
            (element->tag->id == TidyTag_A)) ||
           (BVar4 = DescendantOf(element,TidyTag_A), BVar4 != no)))))) {
        if (((_istackbase->type == EndTag) || (_istackbase->attributes != (AttVal *)0x0)) ||
           ((int)(doc->config).value[0x15].v == 0)) {
          if (((element != (Node *)0x0) && (element->tag != (Dict *)0x0)) &&
             (element->tag->id == TidyTag_A)) {
            prvTidyUngetToken(doc);
          }
          prvTidyReportError(doc,element,_istackbase,0xcf);
          if ((lexer._4_4_ & Preformatted) != IgnoreWhitespace) {
            return;
          }
          TrimSpaces(doc,element);
          return;
        }
        _istackbase->type = EndTag;
        prvTidyReportError(doc,element,_istackbase,0xe0);
        prvTidyUngetToken(doc);
        goto LAB_0012f277;
      }
      BVar4 = prvTidynodeIsElement(_istackbase);
      if (BVar4 == no) {
        if (_istackbase->type == EndTag) {
          prvTidyPopInline(doc,_istackbase);
        }
        prvTidyReportError(doc,element,_istackbase,0xd0);
        prvTidyFreeNode(doc,_istackbase);
        goto LAB_0012f277;
      }
      if ((_istackbase->tag->model & 0x10) == 0) {
        bVar3 = true;
        lexer._4_4_ = IgnoreWhitespace;
      }
      else {
        if (((bVar3) && (_istackbase->implicit == no)) &&
           ((bVar3 = false, (element->tag->model & 0x20000) == 0 &&
            (iVar5 = prvTidyInlineDup(doc,_istackbase), 0 < iVar5)))) goto LAB_0012f277;
        lexer._4_4_ = MixedContent;
      }
      if (((_istackbase != (Node *)0x0) && (_istackbase->tag != (Dict *)0x0)) &&
         (_istackbase->tag->id == TidyTag_BR)) {
        TrimSpaces(doc,element);
      }
      prvTidyInsertNodeAtEnd(element,_istackbase);
      if (_istackbase->implicit != no) {
        prvTidyReportError(doc,element,_istackbase,0xd7);
      }
      ParseTag(doc,_istackbase,IgnoreWhitespace);
    }
  }
  else if (((!bVar3) || (bVar3 = false, (element->tag->model & 0x20000) != 0)) ||
          (iVar5 = prvTidyInlineDup(doc,_istackbase), iVar5 < 1)) {
    prvTidyInsertNodeAtEnd(element,_istackbase);
    lexer._4_4_ = MixedContent;
    if ((((((element != (Node *)0x0) && (element->tag != (Dict *)0x0)) &&
          (element->tag->id == TidyTag_BODY)) ||
         (((element != (Node *)0x0 && (element->tag != (Dict *)0x0)) &&
          (element->tag->id == TidyTag_MAP)))) ||
        (((element != (Node *)0x0 && (element->tag != (Dict *)0x0)) &&
         (element->tag->id == TidyTag_BLOCKQUOTE)))) ||
       ((((element != (Node *)0x0 && (element->tag != (Dict *)0x0)) &&
         (element->tag->id == TidyTag_FORM)) ||
        (((element != (Node *)0x0 && (element->tag != (Dict *)0x0)) &&
         (element->tag->id == TidyTag_NOSCRIPT)))))) {
      prvTidyConstrainVersion(doc,0xfffffedb);
    }
  }
  goto LAB_0012f277;
}

Assistant:

void TY_(ParseBlock)( TidyDocImpl* doc, Node *element, GetTokenMode mode)
{
#if !defined(NDEBUG) && defined(_MSC_VER)
    static int in_parse_block = 0;
    static int parse_block_cnt = 0;
#endif
    Lexer* lexer = doc->lexer;
    Node *node;
    Bool checkstack = yes;
    uint istackbase = 0;
#if !defined(NDEBUG) && defined(_MSC_VER)
    in_parse_block++;
    parse_block_cnt++;
    SPRTF("Entering ParseBlock %d... %d\n",in_parse_block,parse_block_cnt);
#endif

    if ( element->tag->model & CM_EMPTY ) {
#if !defined(NDEBUG) && defined(_MSC_VER)
        in_parse_block--;
        SPRTF("Exit ParseBlockL 1 %d...\n",in_parse_block);
#endif
        return;
    }

    if ( nodeIsFORM(element) && 
         DescendantOf(element, TidyTag_FORM) )
        TY_(ReportError)(doc, element, NULL, ILLEGAL_NESTING );

    /*
     InlineDup() asks the lexer to insert inline emphasis tags
     currently pushed on the istack, but take care to avoid
     propagating inline emphasis inside OBJECT or APPLET.
     For these elements a fresh inline stack context is created
     and disposed of upon reaching the end of the element.
     They thus behave like table cells in this respect.
    */
    if (element->tag->model & CM_OBJECT)
    {
        istackbase = lexer->istackbase;
        lexer->istackbase = lexer->istacksize;
    }

    if (!(element->tag->model & CM_MIXED))
        TY_(InlineDup)( doc, NULL );

    /*\
     *  Issue #212 - If it is likely that it may be necessary
     *  to move a leading space into a text node before this
     *  element, then keep the mode MixedContent to keep any
     *  leading space
    \*/
    if ( !(element->tag->model & CM_INLINE) ||
          (element->tag->model & CM_FIELD ) )
    {
        mode = IgnoreWhitespace;
    }
    else if (mode == IgnoreWhitespace)
    {
        /* Issue #212 - Further fix in case ParseBlock() is called with 'IgnoreWhitespace'
           when such a leading space may need to be inserted before this element to 
           preverve the browser view */
        mode = MixedContent;
    }

    while ((node = TY_(GetToken)(doc, mode /*MixedContent*/)) != NULL)
    {
        /* end tag for this element */
        if (node->type == EndTag && node->tag &&
            (node->tag == element->tag || element->was == node->tag))
        {
            TY_(FreeNode)( doc, node );

            if (element->tag->model & CM_OBJECT)
            {
                /* pop inline stack */
                while (lexer->istacksize > lexer->istackbase)
                    TY_(PopInline)( doc, NULL );
                lexer->istackbase = istackbase;
            }

            element->closed = yes;
            TrimSpaces( doc, element );
#if !defined(NDEBUG) && defined(_MSC_VER)
            in_parse_block--;
            SPRTF("Exit ParseBlock 2 %d...\n",in_parse_block);
#endif
            return;
        }

        if ( nodeIsBODY( node ) && DescendantOf( element, TidyTag_HEAD ))
        {
            /*  If we're in the HEAD, close it before proceeding.
                This is an extremely rare occurance, but has been observed.
            */
            TY_(UngetToken)( doc );
            break;
        }

        if ( nodeIsHTML(node) || nodeIsHEAD(node) || nodeIsBODY(node) )
        {
            if ( TY_(nodeIsElement)(node) )
                TY_(ReportError)(doc, element, node, DISCARDING_UNEXPECTED );
            TY_(FreeNode)( doc, node );
            continue;
        }


        if (node->type == EndTag)
        {
            if (node->tag == NULL)
            {
                TY_(ReportError)(doc, element, node, DISCARDING_UNEXPECTED );
                TY_(FreeNode)( doc, node );
                continue;
            }
            else if ( nodeIsBR(node) )
                node->type = StartTag;
            else if ( nodeIsP(node) )
            {
                /* Cannot have a block inside a paragraph, so no checking
                   for an ancestor is necessary -- but we _can_ have
                   paragraphs inside a block, so change it to an implicit
                   empty paragraph, to be dealt with according to the user's
                   options
                */
                node->type = StartEndTag;
                node->implicit = yes;
#if OBSOLETE
                TY_(CoerceNode)(doc, node, TidyTag_BR, no, no);
                TY_(FreeAttrs)( doc, node ); /* discard align attribute etc. */
                TY_(InsertNodeAtEnd)( element, node );
                node = InferredTag(doc, TidyTag_BR);
#endif
            }
            else if (DescendantOf( element, node->tag->id ))
            {
                /* 
                  if this is the end tag for an ancestor element
                  then infer end tag for this element
                */
                TY_(UngetToken)( doc );
                break;
#if OBSOLETE
                Node *parent;
                for ( parent = element->parent;
                      parent != NULL; 
                      parent = parent->parent )
                {
                    if (node->tag == parent->tag)
                    {
                        if (!(element->tag->model & CM_OPT))
                            TY_(ReportError)(doc, element, node, MISSING_ENDTAG_BEFORE );

                        TY_(UngetToken)( doc );

                        if (element->tag->model & CM_OBJECT)
                        {
                            /* pop inline stack */
                            while (lexer->istacksize > lexer->istackbase)
                                TY_(PopInline)( doc, NULL );
                            lexer->istackbase = istackbase;
                        }

                        TrimSpaces( doc, element );
                        return;
                    }
                }
#endif
            }
            else
            {
                /* special case </tr> etc. for stuff moved in front of table */
                if ( lexer->exiled
                     && (TY_(nodeHasCM)(node, CM_TABLE) || nodeIsTABLE(node)) )
                {
                    TY_(UngetToken)( doc );
                    TrimSpaces( doc, element );
#if !defined(NDEBUG) && defined(_MSC_VER)
                    in_parse_block--;
                    SPRTF("Exit ParseBlock 2 %d...\n",in_parse_block);
#endif
                    return;
                }
            }
        }

        /* mixed content model permits text */
        if (TY_(nodeIsText)(node))
        {
            if ( checkstack )
            {
                checkstack = no;
                if (!(element->tag->model & CM_MIXED))
                {
                    if ( TY_(InlineDup)(doc, node) > 0 )
                        continue;
                }
            }

            TY_(InsertNodeAtEnd)(element, node);
            mode = MixedContent;

            /*
              HTML4 strict doesn't allow mixed content for
              elements with %block; as their content model
            */
            /*
              But only body, map, blockquote, form and
              noscript have content model %block;
            */
            if ( nodeIsBODY(element)       ||
                 nodeIsMAP(element)        ||
                 nodeIsBLOCKQUOTE(element) ||
                 nodeIsFORM(element)       ||
                 nodeIsNOSCRIPT(element) )
                TY_(ConstrainVersion)( doc, ~VERS_HTML40_STRICT );
            continue;
        }

        if ( InsertMisc(element, node) )
            continue;

        /* allow PARAM elements? */
        if ( nodeIsPARAM(node) )
        {
            if ( TY_(nodeHasCM)(element, CM_PARAM) && TY_(nodeIsElement)(node) )
            {
                TY_(InsertNodeAtEnd)(element, node);
                continue;
            }

            /* otherwise discard it */
            TY_(ReportError)(doc, element, node, DISCARDING_UNEXPECTED );
            TY_(FreeNode)( doc, node );
            continue;
        }

        /* allow AREA elements? */
        if ( nodeIsAREA(node) )
        {
            if ( nodeIsMAP(element) && TY_(nodeIsElement)(node) )
            {
                TY_(InsertNodeAtEnd)(element, node);
                continue;
            }

            /* otherwise discard it */
            TY_(ReportError)(doc, element, node, DISCARDING_UNEXPECTED );
            TY_(FreeNode)( doc, node );
            continue;
        }

        /* ignore unknown start/end tags */
        if ( node->tag == NULL )
        {
            TY_(ReportError)(doc, element, node, DISCARDING_UNEXPECTED );
            TY_(FreeNode)( doc, node );
            continue;
        }

        /*
          Allow CM_INLINE elements here.

          Allow CM_BLOCK elements here unless
          lexer->excludeBlocks is yes.

          LI and DD are special cased.

          Otherwise infer end tag for this element.
        */

        if ( !TY_(nodeHasCM)(node, CM_INLINE) )
        {
            if ( !TY_(nodeIsElement)(node) )
            {
                if ( nodeIsFORM(node) )
                    BadForm( doc );

                TY_(ReportError)(doc, element, node, DISCARDING_UNEXPECTED );
                TY_(FreeNode)( doc, node );
                continue;
            }

            /* #427671 - Fix by Randy Waki - 10 Aug 00 */
            /*
             If an LI contains an illegal FRAME, FRAMESET, OPTGROUP, or OPTION
             start tag, discard the start tag and let the subsequent content get
             parsed as content of the enclosing LI.  This seems to mimic IE and
             Netscape, and avoids an infinite loop: without this check,
             ParseBlock (which is parsing the LI's content) and ParseList (which
             is parsing the LI's parent's content) repeatedly defer to each
             other to parse the illegal start tag, each time inferring a missing
             </li> or <li> respectively.

             NOTE: This check is a bit fragile.  It specifically checks for the
             four tags that happen to weave their way through the current series
             of tests performed by ParseBlock and ParseList to trigger the
             infinite loop.
            */
            if ( nodeIsLI(element) )
            {
                if ( nodeIsFRAME(node)    ||
                     nodeIsFRAMESET(node) ||
                     nodeIsOPTGROUP(node) ||
                     nodeIsOPTION(node) )
                {
                    TY_(ReportError)(doc, element, node, DISCARDING_UNEXPECTED );
                    TY_(FreeNode)( doc, node );  /* DSR - 27Apr02 avoid memory leak */
                    continue;
                }
            }

            if ( nodeIsTD(element) || nodeIsTH(element) )
            {
                /* if parent is a table cell, avoid inferring the end of the cell */

                if ( TY_(nodeHasCM)(node, CM_HEAD) )
                {
                    MoveToHead( doc, element, node );
                    continue;
                }

                if ( TY_(nodeHasCM)(node, CM_LIST) )
                {
                    TY_(UngetToken)( doc );
                    node = TY_(InferredTag)(doc, TidyTag_UL);
                    AddClassNoIndent(doc, node);
                    lexer->excludeBlocks = yes;
                }
                else if ( TY_(nodeHasCM)(node, CM_DEFLIST) )
                {
                    TY_(UngetToken)( doc );
                    node = TY_(InferredTag)(doc, TidyTag_DL);
                    lexer->excludeBlocks = yes;
                }

                /* infer end of current table cell */
                if ( !TY_(nodeHasCM)(node, CM_BLOCK) )
                {
                    TY_(UngetToken)( doc );
                    TrimSpaces( doc, element );
#if !defined(NDEBUG) && defined(_MSC_VER)
                    in_parse_block--;
                    SPRTF("Exit ParseBlock 3 %d...\n",in_parse_block);
#endif
                    return;
                }
            }
            else if ( TY_(nodeHasCM)(node, CM_BLOCK) )
            {
                if ( lexer->excludeBlocks )
                {
                    if ( !TY_(nodeHasCM)(element, CM_OPT) )
                        TY_(ReportError)(doc, element, node, MISSING_ENDTAG_BEFORE );

                    TY_(UngetToken)( doc );

                    if ( TY_(nodeHasCM)(element, CM_OBJECT) )
                        lexer->istackbase = istackbase;

                    TrimSpaces( doc, element );
#if !defined(NDEBUG) && defined(_MSC_VER)
                    in_parse_block--;
                    SPRTF("Exit ParseBlock 4 %d...\n",in_parse_block);
#endif
                    return;
                }
            }
            else /* things like list items */
            {
                if (node->tag->model & CM_HEAD)
                {
                    MoveToHead( doc, element, node );
                    continue;
                }

                /*
                 special case where a form start tag
                 occurs in a tr and is followed by td or th
                */

                if ( nodeIsFORM(element) &&
                     nodeIsTD(element->parent) &&
                     element->parent->implicit )
                {
                    if ( nodeIsTD(node) )
                    {
                        TY_(ReportError)(doc, element, node, DISCARDING_UNEXPECTED );
                        TY_(FreeNode)( doc, node );
                        continue;
                    }

                    if ( nodeIsTH(node) )
                    {
                        TY_(ReportError)(doc, element, node, DISCARDING_UNEXPECTED );
                        TY_(FreeNode)( doc, node );
                        node = element->parent;
                        TidyDocFree(doc, node->element);
                        node->element = TY_(tmbstrdup)(doc->allocator, "th");
                        node->tag = TY_(LookupTagDef)( TidyTag_TH );
                        continue;
                    }
                }

                if ( !TY_(nodeHasCM)(element, CM_OPT) && !element->implicit )
                    TY_(ReportError)(doc, element, node, MISSING_ENDTAG_BEFORE );

                TY_(UngetToken)( doc );

                if ( TY_(nodeHasCM)(node, CM_LIST) )
                {
                    if ( element->parent && element->parent->tag &&
                         element->parent->tag->parser == TY_(ParseList) )
                    {
                        TrimSpaces( doc, element );
#if !defined(NDEBUG) && defined(_MSC_VER)
                        in_parse_block--;
                        SPRTF("Exit ParseBlock 5 %d...\n",in_parse_block);
#endif
                        return;
                    }

                    node = TY_(InferredTag)(doc, TidyTag_UL);
                    AddClassNoIndent(doc, node);
                }
                else if ( TY_(nodeHasCM)(node, CM_DEFLIST) )
                {
                    if ( nodeIsDL(element->parent) )
                    {
                        TrimSpaces( doc, element );
#if !defined(NDEBUG) && defined(_MSC_VER)
                        in_parse_block--;
                        SPRTF("Exit ParseBlock 6 %d...\n",in_parse_block);
#endif
                        return;
                    }

                    node = TY_(InferredTag)(doc, TidyTag_DL);
                }
                else if ( TY_(nodeHasCM)(node, CM_TABLE) || TY_(nodeHasCM)(node, CM_ROW) )
                {
                    /* http://tidy.sf.net/issue/1316307 */
                    /* In exiled mode, return so table processing can 
                       continue. */
                    if (lexer->exiled) {
#if !defined(NDEBUG) && defined(_MSC_VER)
                        in_parse_block--;
                        SPRTF("Exit ParseBlock 7 %d...\n",in_parse_block);
#endif
                        return;
                    }
                    node = TY_(InferredTag)(doc, TidyTag_TABLE);
                }
                else if ( TY_(nodeHasCM)(element, CM_OBJECT) )
                {
                    /* pop inline stack */
                    while ( lexer->istacksize > lexer->istackbase )
                        TY_(PopInline)( doc, NULL );
                    lexer->istackbase = istackbase;
                    TrimSpaces( doc, element );
#if !defined(NDEBUG) && defined(_MSC_VER)
                    in_parse_block--;
                    SPRTF("Exit ParseBlock 8 %d...\n",in_parse_block);
#endif
                    return;

                }
                else
                {
                    TrimSpaces( doc, element );
#if !defined(NDEBUG) && defined(_MSC_VER)
                    in_parse_block--;
                    SPRTF("Exit ParseBlock 9 %d...\n",in_parse_block);
#endif
                    return;
                }
            }
        }

        /*\
         *  Issue #307 - an <A> tag to ends any open <A> element
         *  Like #427827 - fixed by Randy Waki and Bjoern Hoehrmann 23 Aug 00
         *  in ParseInline(), fix copied HERE to ParseBlock()
         *  href: http://www.w3.org/TR/html-markup/a.html
         *  The interactive element a must not appear as a descendant of the a element.
        \*/
        if ( nodeIsA(node) && !node->implicit && 
             (nodeIsA(element) || DescendantOf(element, TidyTag_A)) )
        {
            if (node->type != EndTag && node->attributes == NULL
                && cfgBool(doc, TidyCoerceEndTags) )
            {
                node->type = EndTag;
                TY_(ReportError)(doc, element, node, COERCE_TO_ENDTAG);
                TY_(UngetToken)( doc );
                continue;
            }

            if (nodeIsA(element))
            {
                TY_(UngetToken)( doc );
            }
            TY_(ReportError)(doc, element, node, MISSING_ENDTAG_BEFORE);

            if (!(mode & Preformatted))
                TrimSpaces(doc, element);

#if !defined(NDEBUG) && defined(_MSC_VER)
            in_parse_block--;
            SPRTF("Exit ParseBlock 9b %d...\n",in_parse_block);
#endif
            return;
        }

        /* parse known element */
        if (TY_(nodeIsElement)(node))
        {
            if (node->tag->model & CM_INLINE)
            {
                if (checkstack && !node->implicit)
                {
                    checkstack = no;

                    if (!(element->tag->model & CM_MIXED)) /* #431731 - fix by Randy Waki 25 Dec 00 */
                    {
                        if ( TY_(InlineDup)(doc, node) > 0 )
                            continue;
                    }
                }

                mode = MixedContent;
            }
            else
            {
                checkstack = yes;
                mode = IgnoreWhitespace;
            }

            /* trim white space before <br> */
            if ( nodeIsBR(node) )
                TrimSpaces( doc, element );

            TY_(InsertNodeAtEnd)(element, node);
            
            if (node->implicit)
                TY_(ReportError)(doc, element, node, INSERTING_TAG );

            /* Issue #212 - WHY is this hard coded to 'IgnoreWhitespace' while an 
               effort has been made above to set a 'MixedContent' mode in some cases?
               WHY IS THE 'mode' VARIABLE NOT USED HERE???? */
            ParseTag( doc, node, IgnoreWhitespace /*MixedContent*/ );
            continue;
        }

        /* discard unexpected tags */
        if (node->type == EndTag)
            TY_(PopInline)( doc, node );  /* if inline end tag */

        TY_(ReportError)(doc, element, node, DISCARDING_UNEXPECTED );
        TY_(FreeNode)( doc, node );
        continue;
    }

    if (!(element->tag->model & CM_OPT))
        TY_(ReportError)(doc, element, node, MISSING_ENDTAG_FOR);

    if (element->tag->model & CM_OBJECT)
    {
        /* pop inline stack */
        while ( lexer->istacksize > lexer->istackbase )
            TY_(PopInline)( doc, NULL );
        lexer->istackbase = istackbase;
    }

    TrimSpaces( doc, element );
#if !defined(NDEBUG) && defined(_MSC_VER)
    in_parse_block--;
    SPRTF("Exit ParseBlock 10 %d...\n",in_parse_block);
#endif
}